

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_geometry.cpp
# Opt level: O3

Type Internal_ON_ModelGeometry_TypeFilter(Type type)

{
  uint uVar1;
  undefined7 in_register_00000039;
  
  uVar1 = (uint)CONCAT71(in_register_00000039,type);
  if ((0xc < uVar1) || ((0x1201U >> (uVar1 & 0x1f) & 1) == 0)) {
    type = Unset;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_geometry.cpp"
               ,0x75,"","Invalid ON_ModelComponent::Type for ON_ModelGeometryComponent.");
  }
  return type;
}

Assistant:

static ON_ModelComponent::Type Internal_ON_ModelGeometry_TypeFilter(ON_ModelComponent::Type type)
{
  switch (type)
  {
  case ON_ModelComponent::Type::Unset:
    return type;
    break;
  case ON_ModelComponent::Type::Image:
    break;
  case ON_ModelComponent::Type::TextureMapping:
    break;
  case ON_ModelComponent::Type::RenderMaterial:
    break;
  case ON_ModelComponent::Type::LinePattern:
    break;
  case ON_ModelComponent::Type::Layer:
    break;
  case ON_ModelComponent::Type::Group:
    break;
  case ON_ModelComponent::Type::TextStyle:
    break;
  case ON_ModelComponent::Type::DimStyle:
    break;
  case ON_ModelComponent::Type::RenderLight:
    return type;
    break;
  case ON_ModelComponent::Type::HatchPattern:
    break;
  case ON_ModelComponent::Type::InstanceDefinition:
    break;
  case ON_ModelComponent::Type::ModelGeometry:
    return type;
    break;
  case ON_ModelComponent::Type::HistoryRecord:
    break;
  case ON_ModelComponent::Type::Mixed:
    break;
  default:
    break;
  }

  ON_ERROR("Invalid ON_ModelComponent::Type for ON_ModelGeometryComponent.");
  return ON_ModelComponent::Type::Unset;
}